

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

ValueType __thiscall
wabt::interp::Thread::TraceSource::GetLocalType(TraceSource *this,Index stack_slot)

{
  pointer pFVar1;
  ValueType VVar2;
  RefPtr<wabt::interp::DefinedFunc> local_38;
  
  pFVar1 = (this->thread_->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  RefPtr<wabt::interp::DefinedFunc>::RefPtr
            (&local_38,this->thread_->store_,(Ref)pFVar1[-1].func.index);
  VVar2 = FuncDesc::GetLocalType
                    (&(local_38.obj_)->desc_,
                     (int)((ulong)((long)((local_38.obj_)->super_Func).type_.params.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)((local_38.obj_)->super_Func).type_.params.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3) +
                     ((int)((ulong)((long)(this->thread_->values_).
                                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->thread_->values_).
                                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) -
                     (stack_slot + pFVar1[-1].values)));
  if (local_38.obj_ != (DefinedFunc *)0x0) {
    Store::DeleteRoot(local_38.store_,local_38.root_index_);
  }
  return VVar2;
}

Assistant:

ValueType Thread::TraceSource::GetLocalType(Index stack_slot) {
  const Frame& frame = thread_->frames_.back();
  DefinedFunc::Ptr func{thread_->store_, frame.func};
  // When a function is called, the arguments are first pushed on the stack by
  // the caller, then the new call frame is pushed (which caches the current
  // height of the value stack). At that point, any local variables will be
  // allocated on the stack. For example, a function that has two parameters
  // and one local variable will have a stack like this:
  //
  //                 frame.values      top of stack
  //                 v                 v
  //   param1 param2 | local1 ..........
  //
  // When the instruction stream is generated, all local variable access is
  // translated into a value relative to the top of the stack, counting up from
  // 1. So in the previous example, if there are three values above the local
  // variable, the stack looks like:
  //
  //              param1 param2 | local1 value1 value2 value3
  // stack slot:    6      5        4      3      2      1
  // local index:   0      1        2
  //
  // local1 can be accessed with stack_slot 4, and param1 can be accessed with
  // stack_slot 6. The formula below takes these values into account to convert
  // the stack_slot into a local index.
  Index local_index =
      (thread_->values_.size() - frame.values + func->type().params.size()) -
      stack_slot;
  return func->desc().GetLocalType(local_index);
}